

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenerate.cpp
# Opt level: O0

void __thiscall
luna::CodeGenerateVisitor::Visit(CodeGenerateVisitor *this,BreakStatement *break_stmt,void *data)

{
  Instruction line;
  Function *pFVar1;
  SyntaxTree *in_RDX;
  CodeGenerateVisitor *in_RSI;
  CodeGenerateVisitor *in_RDI;
  int index;
  Instruction instruction;
  Function *function;
  OpType in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  
  if (in_RSI[1].current_function_ != (GenerateFunction *)0x0) {
    pFVar1 = GetCurrentFunction(in_RDI);
    line = Instruction::AsBxCode(in_stack_ffffffffffffffd0,(int)((ulong)in_RDI >> 0x20),(int)in_RDI)
    ;
    Function::AddInstruction
              ((Function *)CONCAT44(line.opcode_,in_stack_ffffffffffffffd8),
               (Instruction)(uint)((ulong)pFVar1 >> 0x20),line.opcode_);
    AddLoopJumpInfo(in_RSI,in_RDX,(int)((ulong)pFVar1 >> 0x20),(JumpType)pFVar1);
    return;
  }
  __assert_fail("break_stmt->loop_",
                "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp"
                ,0x31b,"virtual void luna::CodeGenerateVisitor::Visit(BreakStatement *, void *)");
}

Assistant:

void CodeGenerateVisitor::Visit(BreakStatement *break_stmt, void *data)
    {
        assert(break_stmt->loop_);
        auto function = GetCurrentFunction();
        auto instruction = Instruction::AsBxCode(OpType_Jmp, 0, 0);
        int index = function->AddInstruction(instruction, break_stmt->break_.line_);
        AddLoopJumpInfo(break_stmt->loop_, index, LoopJumpInfo::JumpTail);
    }